

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

parser_error parse_entry_combine(parser *p)

{
  int iVar1;
  long *plVar2;
  char *name_00;
  char *name;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  plVar2 = (long *)parser_priv(p);
  if (plVar2 == (long *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name_00 = parser_getstr(p,"combine");
    iVar1 = ui_entry_combiner_lookup(name_00);
    *(int *)(*plVar2 + 0x1ac) = iVar1;
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    if (*(int *)(*plVar2 + 0x1ac) != 0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_entry_combine(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "combine");
	embryo->entry->combiner_index = ui_entry_combiner_lookup(name);
	return (embryo->entry->combiner_index) ?
		PARSE_ERROR_NONE : PARSE_ERROR_INVALID_VALUE;
}